

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O3

int ord2utf8(uint32_t cvalue,uint8_t *utf8bytes)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  byte *pbVar6;
  
  piVar3 = utf8_table1;
  lVar1 = 0;
  do {
    if (cvalue <= (uint)*piVar3) {
      lVar4 = -lVar1;
      pbVar6 = utf8bytes + -lVar1;
      iVar2 = (int)lVar4;
      if (lVar1 == 0) goto LAB_0010ab12;
      goto LAB_0010aaf4;
    }
    lVar1 = lVar1 + -1;
    piVar3 = (int *)((uint *)piVar3 + 1);
  } while (lVar1 != -6);
  pbVar6 = utf8bytes + 6;
  iVar2 = 6;
  lVar4 = 6;
LAB_0010aaf4:
  uVar5 = iVar2 + 1;
  do {
    *pbVar6 = (byte)cvalue & 0x3f | 0x80;
    pbVar6 = pbVar6 + -1;
    cvalue = cvalue >> 6;
    uVar5 = uVar5 - 1;
  } while (1 < uVar5);
LAB_0010ab12:
  *pbVar6 = (byte)cvalue | (byte)utf8_table2[lVar4];
  return iVar2 + 1;
}

Assistant:

static int
ord2utf8(uint32_t cvalue, uint8_t *utf8bytes)
{
register int i, j;
if (cvalue > 0x7fffffffu)
  return -1;
for (i = 0; i < utf8_table1_size; i++)
  if (cvalue <= (uint32_t)utf8_table1[i]) break;
utf8bytes += i;
for (j = i; j > 0; j--)
 {
 *utf8bytes-- = 0x80 | (cvalue & 0x3f);
 cvalue >>= 6;
 }
*utf8bytes = utf8_table2[i] | cvalue;
return i + 1;
}